

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall cmMakefile::ClearMatches(cmMakefile *this)

{
  int iVar1;
  char *pcVar2;
  string *var;
  string *name;
  ulong uVar3;
  allocator local_51;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  pcVar2 = GetDefinition(this,&nMatchesVariable_abi_cxx11_);
  if (pcVar2 != (char *)0x0) {
    iVar1 = atoi(pcVar2);
    if (-1 < iVar1) {
      uVar3 = (ulong)(iVar1 + 1);
      name = matchVariables_abi_cxx11_;
      do {
        pcVar2 = GetDefinition(this,name);
        if (pcVar2 == (char *)0x0) {
          pcVar2 = "";
        }
        std::__cxx11::string::string((string *)&local_50,pcVar2,&local_51);
        if (local_48 != 0) {
          AddDefinition(this,name,"");
          cmStateSnapshot::GetDefinition(&this->StateSnapshot,name);
        }
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        name = name + 1;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
    AddDefinition(this,&nMatchesVariable_abi_cxx11_,"0");
    cmStateSnapshot::GetDefinition(&this->StateSnapshot,&nMatchesVariable_abi_cxx11_);
  }
  return;
}

Assistant:

void cmMakefile::ClearMatches()
{
  const char* nMatchesStr = this->GetDefinition(nMatchesVariable);
  if (!nMatchesStr) {
    return;
  }
  int nMatches = atoi(nMatchesStr);
  for (int i = 0; i <= nMatches; i++) {
    std::string const& var = matchVariables[i];
    std::string const& s = this->GetSafeDefinition(var);
    if (!s.empty()) {
      this->AddDefinition(var, "");
      this->MarkVariableAsUsed(var);
    }
  }
  this->AddDefinition(nMatchesVariable, "0");
  this->MarkVariableAsUsed(nMatchesVariable);
}